

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

string * __thiscall pbrt::ParallelForLoop1D::ToString_abi_cxx11_(ParallelForLoop1D *this)

{
  string *in_RDI;
  int *in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<long_const&,long_const&,int_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ ParallelForLoop1D nextIndex: %d maxIndex: %d "
                            "chunkSize: %d ]",
                            nextIndex, maxIndex, chunkSize);
    }